

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

int __thiscall TMndxMarFile::DoSearch(TMndxMarFile *this,TMndxSearch *pSearch,bool *pbFindResult)

{
  bool bVar1;
  int local_2c;
  int nError;
  bool *pbFindResult_local;
  TMndxSearch *pSearch_local;
  TMndxMarFile *this_local;
  
  local_2c = 0;
  if (this->pDatabase == (TFileNameDatabase *)0x0) {
    this_local._4_4_ = 0x16;
  }
  else if ((pSearch->pStruct40 != (TStruct40 *)0x0) ||
          (local_2c = TMndxSearch::CreateStruct40(pSearch), this_local._4_4_ = local_2c,
          local_2c == 0)) {
    bVar1 = TFileNameDatabase::DoSearch(this->pDatabase,pSearch);
    *pbFindResult = bVar1;
    this_local._4_4_ = local_2c;
  }
  return this_local._4_4_;
}

Assistant:

int DoSearch(TMndxSearch * pSearch, bool * pbFindResult)
    {
        int nError = ERROR_SUCCESS;

        if(pDatabase == NULL)
            return ERROR_INVALID_PARAMETER;

        // Create the pStruct40, if not initialized yet
        if(pSearch->pStruct40 == NULL)
        {
            nError = pSearch->CreateStruct40();
            if(nError != ERROR_SUCCESS)
                return nError;
        }

        *pbFindResult = pDatabase->DoSearch(pSearch);
        return nError;
    }